

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O3

void __thiscall amrex::StateData::StateData(StateData *this)

{
  pointer *__ptr;
  
  (this->m_factory)._M_t.
  super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
  .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl =
       (FabFactory<amrex::FArrayBox> *)0x0;
  this->desc = (StateDescriptor *)0x0;
  (this->domain).smallend.vect[0] = 1;
  (this->domain).smallend.vect[1] = 1;
  (this->domain).smallend.vect[2] = 1;
  (this->domain).bigend.vect[0] = 0;
  (this->domain).bigend.vect[1] = 0;
  *(undefined8 *)((this->domain).bigend.vect + 2) = 0;
  BoxArray::BoxArray(&this->grids);
  DistributionMapping::DistributionMapping(&this->dmap);
  (this->new_time).start = -1e+200;
  (this->new_time).stop = -1e+200;
  (this->old_time).start = -1e+200;
  (this->old_time).stop = -1e+200;
  (this->new_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  (this->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  this->arena = (Arena *)0x0;
  return;
}

Assistant:

StateData::StateData ()
    : desc(nullptr),
      new_time{INVALID_TIME,INVALID_TIME},
      old_time{INVALID_TIME,INVALID_TIME},
      arena(nullptr)
{
}